

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall luna::State::LoadModule(State *this,string *module_name)

{
  anon_union_8_9_8deb4486_for_Value_0 *paVar1;
  Value VVar2;
  
  VVar2 = ModuleManager::GetModuleClosure
                    ((this->module_manager_)._M_t.
                     super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>
                     .super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl,module_name);
  if (VVar2.type_ != ValueT_Nil) {
    paVar1 = &((this->stack_).top_)->field_0;
    (this->stack_).top_ = (Value *)(paVar1 + 2);
    *paVar1 = VVar2.field_0;
    *(ValueT *)(paVar1 + 1) = VVar2.type_;
    return;
  }
  ModuleManager::LoadModule
            ((this->module_manager_)._M_t.
             super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>
             .super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl,module_name);
  return;
}

Assistant:

void State::LoadModule(const std::string &module_name)
    {
        auto value = module_manager_->GetModuleClosure(module_name);
        if (value.IsNil())
            module_manager_->LoadModule(module_name);
        else
            *stack_.top_++ = value;
    }